

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void do_affto(CHAR_DATA *ch,char *argument)

{
  double dVar1;
  bool bVar2;
  short sVar3;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  CHAR_DATA *pCVar11;
  char *__s;
  AFFECT_DATA af;
  char returnstr [4608];
  char targ [4608];
  char saftype [4608];
  char location [4608];
  char skill_name [4608];
  char cname [4608];
  char sbitvector [4608];
  int iVar4;
  
  __s = returnstr;
  memcpy(__s,
         "Syntax:  affto <character> <skill name> <location> <modifier> <duration> <aftype> <bitvector>\n\rLocations:\n\r"
         ,0x6c);
  pCVar11 = (CHAR_DATA *)__s;
  sVar9 = strlen(__s);
  builtin_strncpy(returnstr + sVar9,"\n\rAffect types:\n\r",0x12);
  pcVar10 = flags_to_string(pCVar11,aftype_table,0xf);
  strcat(__s,pcVar10);
  pCVar11 = (CHAR_DATA *)__s;
  sVar9 = strlen(__s);
  builtin_strncpy(returnstr + sVar9,"\n\rBitvectors:\n\r",0x10);
  pcVar10 = flags_to_string(pCVar11,affect_flags,9);
  strcat(__s,pcVar10);
  sVar9 = strlen(__s);
  (returnstr + sVar9)[0] = '\n';
  (returnstr + sVar9)[1] = '\r';
  returnstr[sVar9 + 2] = '\0';
  bVar2 = str_cmp(argument,"");
  if (bVar2) {
    pcVar10 = one_argument(argument,cname);
    pcVar10 = one_argument(pcVar10,skill_name);
    pcVar10 = one_argument(pcVar10,location);
    pcVar10 = one_argument(pcVar10,targ);
    if (targ[0] == '\0') {
      sVar3 = 0;
    }
    else {
      iVar4 = atoi(targ);
      sVar3 = (short)iVar4;
    }
    targ[0] = '\0';
    pcVar10 = one_argument(pcVar10,targ);
    if (targ[0] == '\0') {
      iVar4 = -2;
    }
    else {
      iVar4 = atoi(targ);
    }
    targ[0] = '\0';
    pcVar10 = one_argument(pcVar10,saftype);
    one_argument(pcVar10,sbitvector);
    if (-2 < iVar4 &&
        ((sbitvector[0] != '\0' && saftype[0] != '\0') &&
        (skill_name[0] != '\0' && cname[0] != '\0'))) {
      pCVar11 = get_char_world(ch,cname);
      if (pCVar11 == (CHAR_DATA *)0x0) {
        send_to_char("They aren\'t here.\n\r",ch);
      }
      iVar5 = skill_lookup(skill_name);
      if (iVar5 == -1) {
        __s = "There is no skill by that name.\n\r";
      }
      else {
        iVar6 = display_lookup(location,apply_locations);
        if (iVar6 == 0) {
          bVar2 = str_cmp(location,"none");
          if (bVar2) {
            __s = "There is no affect location by that name.\n\r";
            goto LAB_00329d3c;
          }
        }
        iVar7 = flag_lookup(saftype,aftype_table);
        if (iVar7 == -99) {
          bVar2 = str_cmp(saftype,"AFT_SPELL");
          if (bVar2) {
            __s = "There is no aftype by that name.\n\r";
            goto LAB_00329d3c;
          }
        }
        iVar8 = flag_lookup(sbitvector,affect_flags);
        if (iVar8 == -99) {
          __s = "Invalid bitvector.\n\r";
        }
        else {
          init_affect(&af);
          af.where = 0;
          af.type = (short)iVar5;
          af.level = ch->level;
          af.location = (short)iVar6;
          af.duration = (short)iVar4;
          af.modifier = sVar3;
          af.aftype = iVar7;
          dVar1 = ldexp(1.0,iVar8 % 0x20);
          af.bitvector[iVar8 / 0x20] = af.bitvector[iVar8 / 0x20] | (long)dVar1;
          affect_to_char(pCVar11,&af);
          bVar2 = is_npc(pCVar11);
          __s = returnstr;
          sprintf(__s,"%s has been given the %s affect.\n\r",(&pCVar11->name)[(ulong)bVar2 * 4],
                  skill_table[iVar5].name);
        }
      }
    }
  }
LAB_00329d3c:
  send_to_char(__s,ch);
  return;
}

Assistant:

void do_affto(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	CHAR_DATA *victim;
	char cname[MAX_INPUT_LENGTH], skill_name[MAX_INPUT_LENGTH], location[MAX_INPUT_LENGTH],
		targ[MAX_INPUT_LENGTH], saftype[MAX_INPUT_LENGTH], sbitvector[MAX_INPUT_LENGTH];
	int duration = -2, sn = 2, nlocation = -2, modifier = 0, aftype = -2;
	long bitvector = 0;
	char returnstr[MAX_INPUT_LENGTH];

	sprintf(returnstr, "Syntax:  affto <character> <skill name> <location> <modifier> <duration> <aftype> <bitvector>\n\rLocations:\n\r");
	strcat(returnstr, "\n\rAffect types:\n\r");
	strcat(returnstr, flags_to_string(ch, aftype_table, 15));
	strcat(returnstr, "\n\rBitvectors:\n\r");
	strcat(returnstr, flags_to_string(ch, affect_flags, 9));
	strcat(returnstr, "\n\r");

	if (!str_cmp(argument, ""))
	{
		send_to_char(returnstr, ch);
		return;
	}

	argument = one_argument(argument, cname);
	argument = one_argument(argument, skill_name);
	argument = one_argument(argument, location);
	argument = one_argument(argument, targ);

	if (targ[0] != '\0')
		modifier = atoi(targ);

	targ[0] = '\0';
	argument = one_argument(argument, targ);

	if (targ[0] != '\0')
		duration = atoi(targ);

	targ[0] = '\0';
	argument = one_argument(argument, saftype);
	argument = one_argument(argument, sbitvector);

	if (targ[0] != '\0')
		bitvector = atoi(targ);

	if (cname[0] == '\0' || skill_name[0] == '\0' || saftype[0] == '\0' || sbitvector[0] == '\0' || duration < -1)
	{
		send_to_char(returnstr, ch);
		return;
	}

	victim = get_char_world(ch, cname);

	if (!victim)
	{
		send_to_char("They aren't here.\n\r", ch);
	}

	sn = skill_lookup(skill_name);

	if (sn == -1)
	{
		send_to_char("There is no skill by that name.\n\r", ch);
		return;
	}

	nlocation = display_lookup(location, apply_locations);

	if (nlocation == 0 && str_cmp(location, "none"))
	{
		send_to_char("There is no affect location by that name.\n\r", ch);
		return;
	}

	aftype = flag_lookup(saftype, aftype_table);

	if (aftype == NO_FLAG && str_cmp(saftype, "AFT_SPELL"))
	{
		send_to_char("There is no aftype by that name.\n\r", ch);
		return;
	}

	bitvector = flag_lookup(sbitvector, affect_flags);

	if (bitvector == NO_FLAG)
	{
		send_to_char("Invalid bitvector.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = aftype;
	af.level = ch->level;
	af.location = nlocation;
	af.modifier = modifier;
	af.duration = duration;
	SET_BIT(af.bitvector, bitvector);
	affect_to_char(victim, &af);

	sprintf(returnstr, "%s has been given the %s affect.\n\r", is_npc(victim) ? victim->short_descr : victim->name, skill_table[sn].name);
	send_to_char(returnstr, ch);
}